

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type-printing.h
# Opt level: O2

void __thiscall
wasm::IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>>::
IndexedTypeNameGenerator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
          (IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>>
           *this,vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types,
          IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> *fallback,string *prefix)

{
  pointer pHVar1;
  long lVar2;
  ulong __val;
  pair<const_wasm::HeapType,_wasm::TypeNames> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  TypeNames local_98;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_50;
  string *local_48;
  IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>> *local_40
  ;
  __hashtable *__h;
  
  __h = (__hashtable *)(this + 0x20);
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>> **)
   (this + 0x20) = this + 0x50;
  *(undefined8 *)(this + 0x28) = 1;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined4 *)(this + 0x40) = 0x3f800000;
  *(undefined8 *)(this + 0x48) = 0;
  *(undefined8 *)(this + 0x50) = 0;
  *(IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator> **)(this + 0x58) = fallback;
  local_40 = this + 0x60;
  *(IndexedTypeNameGenerator<wasm::IndexedTypeNameGenerator<wasm::DefaultTypeNameGenerator>> **)
   (this + 0x60) = this + 0x90;
  *(undefined8 *)(this + 0x68) = 1;
  *(undefined8 *)(this + 0x70) = 0;
  *(undefined8 *)(this + 0x78) = 0;
  *(undefined4 *)(this + 0x80) = 0x3f800000;
  *(undefined8 *)(this + 0x88) = 0;
  *(undefined8 *)(this + 0x90) = 0;
  lVar2 = 0;
  local_50 = types;
  local_48 = prefix;
  for (__val = 0;
      pHVar1 = (local_50->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
               _M_impl.super__Vector_impl_data._M_start,
      __val < (ulong)((long)(local_50->
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pHVar1 >> 3);
      __val = __val + 1) {
    std::__cxx11::to_string(&local_b8,__val);
    std::operator+(&local_d8,local_48,&local_b8);
    IString::IString((IString *)&local_98,&local_d8);
    local_98.fieldNames._M_h._M_buckets = &local_98.fieldNames._M_h._M_single_bucket;
    local_98.fieldNames._M_h._M_bucket_count = 1;
    local_98.fieldNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_98.fieldNames._M_h._M_element_count = 0;
    local_98.fieldNames._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_98.fieldNames._M_h._M_rehash_policy._4_4_ = 0;
    local_98.fieldNames._M_h._M_rehash_policy._M_next_resize = 0;
    local_98.fieldNames._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::pair<const_wasm::HeapType,_wasm::TypeNames>::pair<wasm::HeapType_&,_true>
              (&local_128,(HeapType *)((long)&pHVar1->id + lVar2),&local_98);
    std::
    _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::TypeNames>,std::allocator<std::pair<wasm::HeapType_const,wasm::TypeNames>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<wasm::HeapType_const,wasm::TypeNames>>
              ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::TypeNames>,std::allocator<std::pair<wasm::HeapType_const,wasm::TypeNames>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)local_40,&local_128);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_128.second.fieldNames._M_h);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_98.fieldNames._M_h);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    lVar2 = lVar2 + 8;
  }
  return;
}

Assistant:

IndexedTypeNameGenerator(T& types,
                           FallbackGenerator& fallback,
                           const std::string& prefix = "")
    : fallback(fallback) {
    for (size_t i = 0; i < types.size(); ++i) {
      names.insert({types[i], {prefix + std::to_string(i), {}}});
    }
  }